

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O1

void __thiscall QGraphicsRotation::applyTo(QGraphicsRotation *this,QMatrix4x4 *matrix)

{
  double dVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(this + 8);
  dVar1 = *(double *)(lVar3 + 0x90);
  if (((dVar1 != 0.0) || (NAN(dVar1))) &&
     (((*(float *)(lVar3 + 0x98) != 0.0 ||
       (((NAN(*(float *)(lVar3 + 0x98)) || (*(float *)(lVar3 + 0x9c) != 0.0)) ||
        (NAN(*(float *)(lVar3 + 0x9c)))))) ||
      ((*(float *)(lVar3 + 0xa0) != 0.0 || (NAN(*(float *)(lVar3 + 0xa0)))))))) {
    cVar4 = qIsNaN(dVar1);
    if (cVar4 == '\0') {
      QMatrix4x4::translate((QVector3D *)matrix);
      QMatrix4x4::projectedRotate
                ((float)*(double *)(lVar3 + 0x90),*(float *)(lVar3 + 0x98),*(float *)(lVar3 + 0x9c),
                 *(float *)(lVar3 + 0xa0));
      QMatrix4x4::translate((QVector3D *)matrix);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsRotation::applyTo(QMatrix4x4 *matrix) const
{
    Q_D(const QGraphicsRotation);

    if (d->angle == 0. || d->axis.isNull() || qIsNaN(d->angle))
        return;

    matrix->translate(d->origin);
    matrix->projectedRotate(d->angle, d->axis.x(), d->axis.y(), d->axis.z());
    matrix->translate(-d->origin);
}